

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Statement * __thiscall soul::StructuralParser::parseStatement(StructuralParser *this)

{
  char *pcVar1;
  char *pcVar2;
  SourceCodeText *o;
  SourceCodeText *pSVar3;
  pool_ref<soul::AST::VariableDeclaration> *ppVar4;
  bool bVar5;
  int iVar6;
  Statement *pSVar7;
  Expression *pEVar8;
  Identifier name;
  Block *pBVar9;
  long lVar10;
  long lVar11;
  VariableDeclaration *unaff_R15;
  pool_ref<soul::AST::Statement> local_b8;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL> variablesCreated;
  pool_ptr<soul::AST::Expression> type;
  Context local_50;
  UTF8Reader local_38;
  
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == "{") || ((pcVar1 != (char *)0x0 && (iVar6 = strcmp(pcVar1,"{"), iVar6 == 0)))) {
    local_38.data = (char *)0x0;
    pBVar9 = parseBracedBlock(this,(pool_ptr<soul::AST::Function> *)&local_38);
    return &pBVar9->super_Statement;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288cb8);
  if (bVar5) {
    pSVar7 = parseIf(this);
    return pSVar7;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x284ec3);
  if (bVar5) {
    pSVar7 = parseWhileLoop(this);
    return pSVar7;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x28877e);
  if (bVar5) {
    pSVar7 = parseForLoop(this);
    return pSVar7;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x287985);
  if (bVar5) {
    pSVar7 = parseLoopStatement(this);
    return pSVar7;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x284ee7);
  if (bVar5) {
    pSVar7 = parseReturn(this);
    return pSVar7;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x284ec9);
  if (bVar5) {
    variablesCreated.items =
         (pool_ref<soul::AST::VariableDeclaration> *)
         (this->super_SOULTokeniser).location.sourceCode.object;
    if ((SourceCodeText *)variablesCreated.items != (SourceCodeText *)0x0) {
      (((SourceCodeText *)variablesCreated.items)->super_RefCountedObject).refCount =
           (((SourceCodeText *)variablesCreated.items)->super_RefCountedObject).refCount + 1;
    }
    variablesCreated.numActive = (size_t)(this->super_SOULTokeniser).location.location.data;
    variablesCreated.numAllocated = (size_t)this->currentScope;
    pSVar7 = &PoolAllocator::allocate<soul::AST::BreakStatement,soul::AST::Context>
                        (&this->allocator->pool,(Context *)&variablesCreated)->super_Statement;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261d5f);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)variablesCreated.items);
    return pSVar7;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x284f1a);
  if (bVar5) {
    variablesCreated.items =
         (pool_ref<soul::AST::VariableDeclaration> *)
         (this->super_SOULTokeniser).location.sourceCode.object;
    if ((SourceCodeText *)variablesCreated.items != (SourceCodeText *)0x0) {
      (((SourceCodeText *)variablesCreated.items)->super_RefCountedObject).refCount =
           (((SourceCodeText *)variablesCreated.items)->super_RefCountedObject).refCount + 1;
    }
    variablesCreated.numActive = (size_t)(this->super_SOULTokeniser).location.location.data;
    variablesCreated.numAllocated = (size_t)this->currentScope;
    pSVar7 = &PoolAllocator::allocate<soul::AST::ContinueStatement,soul::AST::Context>
                        (&this->allocator->pool,(Context *)&variablesCreated)->super_Statement;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261d5f);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)variablesCreated.items);
    return pSVar7;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x284ea8);
  if (bVar5) {
    bVar5 = true;
LAB_001e72d1:
    pSVar7 = parseLocalLetOrVar(this,bVar5);
    return pSVar7;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x284eac);
  if (bVar5) {
    bVar5 = false;
    goto LAB_001e72d1;
  }
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == "external") ||
     ((pcVar1 != (char *)0x0 && (iVar6 = strcmp(pcVar1,"external"), iVar6 == 0)))) {
    CompileMessageHelpers::createMessage<>
              ((CompileMessage *)&variablesCreated,syntax,error,
               "External constants cannot be declared inside a function");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&variablesCreated);
    CompileMessage::~CompileMessage((CompileMessage *)&variablesCreated);
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261d5f);
  if (bVar5) {
    pSVar7 = getNoop(this);
    return pSVar7;
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261dd5);
  if (bVar5) {
    bVar5 = true;
  }
  else {
    bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x28452b);
    if (!bVar5) {
      pcVar1 = (this->super_SOULTokeniser).currentType.text;
      if ((pcVar1 == "(") || ((pcVar1 != (char *)0x0 && (iVar6 = strcmp(pcVar1,"("), iVar6 == 0))))
      {
        pEVar8 = parseFactor(this);
      }
      else {
        bVar5 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                ::
                matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                          ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                            *)this,(TokenType)0x26369e,(TokenType)0x2636a9,(TokenType)0x263743,
                           (TokenType)0x26374c,(TokenType)0x263707,(TokenType)0x28452c,
                           (TokenType)0x263733,(TokenType)0x26373b);
        if (bVar5) {
          bVar5 = false;
        }
        else {
          pcVar1 = (this->super_SOULTokeniser).location.location.data;
          tryParsingType((StructuralParser *)&type,(ParseTypeContext)this);
          bVar5 = true;
          if ((type.object != (Expression *)0x0) &&
             ((pcVar2 = (this->super_SOULTokeniser).currentType.text, pcVar2 == "$identifier" ||
              ((pcVar2 != (char *)0x0 && (iVar6 = strcmp(pcVar2,"$identifier"), iVar6 == 0)))))) {
            if ((pcVar2 == "(") ||
               ((pcVar2 != (char *)0x0 && (iVar6 = strcmp(pcVar2,"("), iVar6 == 0)))) {
              CompileMessageHelpers::createMessage<>
                        ((CompileMessage *)&variablesCreated,syntax,error,
                         "Expected a variable declaration");
              (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&variablesCreated);
              CompileMessage::~CompileMessage((CompileMessage *)&variablesCreated);
            }
            o = (this->super_SOULTokeniser).location.sourceCode.object;
            if (o != (SourceCodeText *)0x0) {
              (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
            }
            pcVar2 = (this->super_SOULTokeniser).location.location.data;
            pSVar3 = (SourceCodeText *)this->currentScope;
            variablesCreated.items =
                 (pool_ref<soul::AST::VariableDeclaration> *)variablesCreated.space;
            variablesCreated.numActive = 0;
            variablesCreated.numAllocated = 8;
            if (type.object == (Expression *)0x0) {
              throwInternalCompilerError("object != nullptr","operator*",0x3b);
            }
            name = parseIdentifier(this);
            if (o != (SourceCodeText *)0x0) {
              (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
            }
            local_b8.object = (Statement *)&variablesCreated;
            local_50.location.sourceCode.object = o;
            local_50.location.location.data = pcVar2;
            local_50.parentScope = (Scope *)pSVar3;
            parseVariableDeclaration<soul::StructuralParser::parseStatement()::_lambda(soul::AST::VariableDeclaration&)_1_>
                      (this,type.object,name,false,&local_50,(anon_class_8_1_55c32bef *)&local_b8);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.location.sourceCode.object);
            ppVar4 = variablesCreated.items;
            if (variablesCreated.numActive == 1) {
              unaff_R15 = (variablesCreated.items)->object;
            }
            else {
              if (variablesCreated.numActive != 0) {
                lVar11 = variablesCreated.numActive << 3;
                lVar10 = 0;
                do {
                  pBVar9 = getCurrentBlock(this);
                  local_b8.object = *(Statement **)((long)&ppVar4->object + lVar10);
                  std::
                  vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
                  ::emplace_back<soul::pool_ref<soul::AST::Statement>>
                            ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
                              *)&pBVar9->statements,&local_b8);
                  lVar10 = lVar10 + 8;
                } while (lVar11 != lVar10);
              }
              unaff_R15 = (VariableDeclaration *)getNoop(this);
            }
            variablesCreated.numActive = 0;
            if (8 < variablesCreated.numAllocated) {
              if (variablesCreated.items != (pool_ref<soul::AST::VariableDeclaration> *)0x0) {
                operator_delete__(variablesCreated.items);
              }
              variablesCreated.items =
                   (pool_ref<soul::AST::VariableDeclaration> *)variablesCreated.space;
              variablesCreated.numAllocated = 8;
            }
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
            bVar5 = false;
          }
          if (!bVar5) {
            return &unaff_R15->super_Statement;
          }
          if ((this->super_SOULTokeniser).input.data != pcVar1) {
            (this->super_SOULTokeniser).input.data = pcVar1;
            Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::skip(&this->super_SOULTokeniser);
          }
          if (!bVar5) {
            return &unaff_R15->super_Statement;
          }
          pcVar1 = (this->super_SOULTokeniser).currentType.text;
          if ((pcVar1 != "$identifier") &&
             ((pcVar1 == (char *)0x0 || (iVar6 = strcmp(pcVar1,"$identifier"), iVar6 != 0)))) {
            giveErrorOnExternalKeyword(this);
            giveErrorOnAssignmentToProcessorProperty(this);
          }
          bVar5 = true;
        }
        pEVar8 = parseExpression(this,bVar5);
      }
      goto LAB_001e7397;
    }
    bVar5 = false;
  }
  pEVar8 = parsePreIncDec(this,bVar5);
LAB_001e7397:
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261d5f);
  return &pEVar8->super_Statement;
}

Assistant:

AST::Statement& parseStatement()
    {
        if (matches (Operator::openBrace))     return parseBracedBlock ({});
        if (matchIf (Keyword::if_))            return parseIf();
        if (matchIf (Keyword::while_))         return parseWhileLoop();
        if (matchIf (Keyword::for_))           return parseForLoop();
        if (matchIf (Keyword::loop))           return parseLoopStatement();
        if (matchIf (Keyword::return_))        return parseReturn();
        if (matchIf (Keyword::break_))         return matchEndOfStatement (allocate<AST::BreakStatement> (getContext()));
        if (matchIf (Keyword::continue_))      return matchEndOfStatement (allocate<AST::ContinueStatement> (getContext()));
        if (matchIf (Keyword::let))            return parseLocalLetOrVar (true);
        if (matchIf (Keyword::var))            return parseLocalLetOrVar (false);
        if (matches (Keyword::external))       throwError (Errors::externalNotAllowedInFunction());
        if (matchIf (Operator::semicolon))     return getNoop();
        if (matchIf (Operator::plusplus))      return matchEndOfStatement (parsePreIncDec (true));
        if (matchIf (Operator::minusminus))    return matchEndOfStatement (parsePreIncDec (false));
        if (matches (Operator::openParen))     return matchEndOfStatement (parseFactor());

        if (matchesAny (Token::literalInt32, Token::literalInt64, Token::literalFloat64,
                        Token::literalFloat32, Token::literalString, Operator::minus,
                        Token::literalImag32, Token::literalImag64))
            return parseExpressionAsStatement (false);

        {
            auto oldPos = getCurrentTokeniserPosition();

            if (auto type = tryParsingType (ParseTypeContext::variableType))
            {
                if (matches (Token::identifier))
                {
                    if (matches (Operator::openParen))
                        throwError (Errors::expectedVariableDecl());

                    auto context = getContext();
                    ArrayWithPreallocation<pool_ref<AST::VariableDeclaration>, 8> variablesCreated;

                    parseVariableDeclaration (*type, parseIdentifier(), false, context,
                                              [&] (AST::VariableDeclaration& v) { variablesCreated.push_back (v); });

                    if (variablesCreated.size() == 1)
                        return variablesCreated.front();

                    for (auto& v : variablesCreated)
                        getCurrentBlock().addStatement (v);

                    return getNoop();
                }
            }

            resetPosition (oldPos);
        }

        if (! matches (Token::identifier))
        {
            giveErrorOnExternalKeyword();
            giveErrorOnAssignmentToProcessorProperty();
        }

        return parseExpressionAsStatement (true);
    }